

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O1

void __thiscall trun::TestResponseProxy::TerminateThreadIfNeeded(TestResponseProxy *this)

{
  Config *pCVar1;
  
  pCVar1 = Config::Instance();
  if (pCVar1->testExecutionType != kThreadedWithExit) {
    return;
  }
  pthread_exit((void *)0x0);
}

Assistant:

void TestResponseProxy::TerminateThreadIfNeeded() {

    // FIXME: In case of V1 we should have this enabled - but we don't know the library at this point
#ifdef TRUN_HAVE_THREADS
    if (Config::Instance().testExecutionType == TestExecutiontype::kThreadedWithExit) {
        #ifdef WIN32
            TerminateThread(GetCurrentThread(), 0);
        #else
            pthread_exit(NULL);
        #endif
    }
#endif

}